

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O2

suppWrap *
Bmatch_FindSuppWrap(vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *a,suppWrap **b)

{
  long lVar1;
  pointer ppVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  ppVar2 = (a->
           super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(a->
                        super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 5;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar4 == uVar5) {
      return (suppWrap *)0x0;
    }
    lVar3 = *(long *)&ppVar2[uVar4].second.
                      super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl;
    uVar6 = (ulong)((long)*(pointer *)
                           ((long)&ppVar2[uVar4].second.
                                   super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                   _M_impl + 8) - lVar3) >> 3;
    uVar7 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar7 = 0;
    }
    uVar6 = 0;
    while (uVar7 != uVar6) {
      lVar1 = uVar6 * 8;
      uVar6 = uVar6 + 1;
      if (*(suppWrap **)(lVar3 + lVar1) == *b) {
        return ppVar2[uVar4].first;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

suppWrap * Bmatch_FindSuppWrap( const vector< pair< suppWrap *, vector< suppWrap * > > > & a, suppWrap * & b )
{
	for( int i = 0, n = a.size(); i < n; ++i ) {
		for( int j = 0, m = a[i].second.size(); j < m; ++j ) {
			if( a[i].second[j] == b ) {
				return a[i].first;
			}
		}
	}
	return NULL;
}